

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

unsigned_long_long
ImGui::RoundScalarWithFormatT<unsigned_long_long,long_long>
          (char *format,ImGuiDataType data_type,unsigned_long_long v)

{
  char *pcVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  char *src;
  double dVar6;
  char fmt_sanitized [32];
  char v_str [64];
  unsigned_long_long local_80;
  byte local_78 [31];
  char local_59;
  char local_58 [72];
  
  bVar2 = *format;
  while( true ) {
    if (bVar2 == 0) {
      return v;
    }
    if ((bVar2 == 0x25) && (((byte *)format)[1] != 0x25)) break;
    format = (char *)((byte *)format + (ulong)(bVar2 == 0x25) + 1);
    bVar2 = *format;
  }
  local_80 = v;
  pbVar3 = (byte *)ImParseFormatFindEnd(format);
  pbVar4 = local_78;
  if (format < pbVar3) {
    do {
      uVar5 = (byte)*format - 0x24;
      if ((0x3b < uVar5) || ((0x800000000000009U >> ((ulong)uVar5 & 0x3f) & 1) == 0)) {
        *pbVar4 = *format;
        pbVar4 = pbVar4 + 1;
      }
      format = (char *)((byte *)format + 1);
    } while ((byte *)format != pbVar3);
  }
  *pbVar4 = 0;
  ImFormatString(local_58,0x40,(char *)local_78,local_80);
  src = &local_59;
  do {
    pcVar1 = src + 1;
    src = src + 1;
  } while (*pcVar1 == ' ');
  if ((data_type & 0xfffffffeU) == 8) {
    dVar6 = atof(src);
    local_80 = (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6;
  }
  else {
    ImAtoi<long_long>(src,(longlong *)&local_80);
  }
  return local_80;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    SanitizeFormatString(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}